

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O3

Uint32 Diligent::FindImmutableSampler
                 (ImmutableSamplerDesc *ImtblSamplers,Uint32 NumImtblSamplers,
                 SHADER_TYPE ShaderStages,char *ResourceName,char *SamplerSuffix)

{
  bool bVar1;
  ulong uVar2;
  char (*pacVar3) [95];
  string msg;
  string local_58;
  char *local_38;
  
  pacVar3 = (char (*) [95])SamplerSuffix;
  local_38 = ResourceName;
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x14e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumImtblSamplers != 0) {
    uVar2 = 0;
    do {
      if (((ImtblSamplers->ShaderStages & ShaderStages) != SHADER_TYPE_UNKNOWN) &&
         (bVar1 = StreqSuff(ResourceName,ImtblSamplers->SamplerOrTextureName,SamplerSuffix,false),
         bVar1)) {
        if ((ShaderStages & ~ImtblSamplers->ShaderStages) != SHADER_TYPE_UNKNOWN) {
          FormatString<char[63],char_const*,char[95]>
                    (&local_58,
                     (Diligent *)"Immutable sampler uses only some of the stages that resource \'",
                     (char (*) [63])&local_38,
                     (char **)
                     "\' is defined for. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                     ,pacVar3);
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"FindImmutableSampler",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x156);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        return (Uint32)uVar2;
      }
      uVar2 = uVar2 + 1;
      ImtblSamplers = ImtblSamplers + 1;
    } while (NumImtblSamplers != uVar2);
  }
  return 0xffffffff;
}

Assistant:

Uint32 FindImmutableSampler(const ImmutableSamplerDesc ImtblSamplers[],
                            Uint32                     NumImtblSamplers,
                            SHADER_TYPE                ShaderStages,
                            const char*                ResourceName,
                            const char*                SamplerSuffix)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 s = 0; s < NumImtblSamplers; ++s)
    {
        const ImmutableSamplerDesc& Sam = ImtblSamplers[s];
        if (((Sam.ShaderStages & ShaderStages) != 0) && StreqSuff(ResourceName, Sam.SamplerOrTextureName, SamplerSuffix))
        {
            VERIFY((Sam.ShaderStages & ShaderStages) == ShaderStages,
                   "Immutable sampler uses only some of the stages that resource '", ResourceName,
                   "' is defined for. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
            return s;
        }
    }

    return InvalidImmutableSamplerIndex;
}